

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KangarooTwelve.c
# Opt level: O0

int KangarooTwelve_Update(KangarooTwelve_Instance *ktInstance,uchar *input,size_t inLen)

{
  int iVar1;
  ulong in_RDX;
  long in_RDI;
  uchar intermediate_1 [32];
  uint len_2;
  uchar intermediate [32];
  uint len_1;
  uchar padding;
  uint len;
  KeccakWidth1600_12rounds_SpongeInstance *in_stack_ffffffffffffff58;
  ulong local_a0;
  ulong local_98;
  ulong in_stack_ffffffffffffff70;
  ulong uVar2;
  uchar *in_stack_ffffffffffffff78;
  KeccakWidth1600_12rounds_SpongeInstance *in_stack_ffffffffffffff80;
  KeccakWidth1600_12rounds_SpongeInstance *in_stack_ffffffffffffff88;
  ulong local_20;
  
  if (*(int *)(in_RDI + 0x1c4) != 1) {
    return 1;
  }
  if (*(long *)(in_RDI + 0x1b8) == 0) {
    uVar2 = in_RDX;
    if (0x2000 - *(int *)(in_RDI + 0x1c0) <= in_RDX) {
      uVar2 = (ulong)(0x2000 - *(int *)(in_RDI + 0x1c0));
    }
    in_stack_ffffffffffffff70 = uVar2;
    iVar1 = KeccakWidth1600_12rounds_SpongeAbsorb
                      (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80->state,
                       (size_t)in_stack_ffffffffffffff78);
    if (iVar1 != 0) {
      return 1;
    }
    local_20 = in_RDX - (uVar2 & 0xffffffff);
    *(int *)(in_RDI + 0x1c0) = (int)uVar2 + *(int *)(in_RDI + 0x1c0);
    if ((*(int *)(in_RDI + 0x1c0) == 0x2000) && (local_20 != 0)) {
      *(undefined4 *)(in_RDI + 0x1c0) = 0;
      *(undefined8 *)(in_RDI + 0x1b8) = 1;
      iVar1 = KeccakWidth1600_12rounds_SpongeAbsorb
                        (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80->state,
                         (size_t)in_stack_ffffffffffffff78);
      if (iVar1 != 0) {
        return 1;
      }
      *(uint *)(in_RDI + 0x1a4) = *(int *)(in_RDI + 0x1a4) + 7U & 0xfffffff8;
    }
  }
  else {
    local_20 = in_RDX;
    if (*(int *)(in_RDI + 0x1c0) != 0) {
      local_98 = in_RDX;
      if (0x2000 - *(int *)(in_RDI + 0x1c0) <= in_RDX) {
        local_98 = (ulong)(0x2000 - *(int *)(in_RDI + 0x1c0));
      }
      iVar1 = KeccakWidth1600_12rounds_SpongeAbsorb
                        (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80->state,
                         (size_t)in_stack_ffffffffffffff78);
      if (iVar1 != 0) {
        return 1;
      }
      local_20 = in_RDX - (local_98 & 0xffffffff);
      *(int *)(in_RDI + 0x1c0) = (int)local_98 + *(int *)(in_RDI + 0x1c0);
      if (*(int *)(in_RDI + 0x1c0) == 0x2000) {
        *(undefined4 *)(in_RDI + 0x1c0) = 0;
        *(long *)(in_RDI + 0x1b8) = *(long *)(in_RDI + 0x1b8) + 1;
        iVar1 = KeccakWidth1600_12rounds_SpongeAbsorbLastFewBits(in_stack_ffffffffffffff58,'\0');
        if (iVar1 != 0) {
          return 1;
        }
        iVar1 = KeccakWidth1600_12rounds_SpongeSqueeze
                          (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                           in_stack_ffffffffffffff70);
        if (iVar1 != 0) {
          return 1;
        }
        iVar1 = KeccakWidth1600_12rounds_SpongeAbsorb
                          (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80->state,
                           (size_t)in_stack_ffffffffffffff78);
        if (iVar1 != 0) {
          return 1;
        }
      }
    }
  }
  while( true ) {
    while( true ) {
      if (local_20 == 0) {
        return 0;
      }
      if (local_20 < 0x2000) {
        local_a0 = local_20;
      }
      else {
        local_a0 = 0x2000;
      }
      iVar1 = KeccakWidth1600_12rounds_SpongeInitialize(in_stack_ffffffffffffff58,0,0x141d48);
      if (iVar1 != 0) {
        return 1;
      }
      iVar1 = KeccakWidth1600_12rounds_SpongeAbsorb
                        (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80->state,
                         (size_t)in_stack_ffffffffffffff78);
      if (iVar1 != 0) {
        return 1;
      }
      local_20 = local_20 - (local_a0 & 0xffffffff);
      if ((int)local_a0 == 0x2000) break;
      *(int *)(in_RDI + 0x1c0) = (int)local_a0;
    }
    *(long *)(in_RDI + 0x1b8) = *(long *)(in_RDI + 0x1b8) + 1;
    iVar1 = KeccakWidth1600_12rounds_SpongeAbsorbLastFewBits(in_stack_ffffffffffffff58,'\0');
    if (iVar1 != 0) {
      return 1;
    }
    iVar1 = KeccakWidth1600_12rounds_SpongeSqueeze
                      (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70
                      );
    if (iVar1 != 0) break;
    iVar1 = KeccakWidth1600_12rounds_SpongeAbsorb
                      (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80->state,
                       (size_t)in_stack_ffffffffffffff78);
    if (iVar1 != 0) {
      return 1;
    }
  }
  return 1;
}

Assistant:

int KangarooTwelve_Update(KangarooTwelve_Instance *ktInstance, const unsigned char *input, size_t inLen)
{
    if (ktInstance->phase != ABSORBING)
        return 1;

    if ( ktInstance->blockNumber == 0 ) {
        /* First block, absorb in final node */
        unsigned int len = (inLen < (chunkSize - ktInstance->queueAbsorbedLen)) ? inLen : (chunkSize - ktInstance->queueAbsorbedLen);
        if (KeccakWidth1600_12rounds_SpongeAbsorb(&ktInstance->finalNode, input, len) != 0)
            return 1;
        input += len;
        inLen -= len;
        ktInstance->queueAbsorbedLen += len;
        if ( (ktInstance->queueAbsorbedLen == chunkSize) && (inLen != 0) ) {
            /* First block complete and more input data available, finalize it */
            const unsigned char padding = 0x03; /* '110^6': message hop, simple padding */
            ktInstance->queueAbsorbedLen = 0;
            ktInstance->blockNumber = 1;
            if (KeccakWidth1600_12rounds_SpongeAbsorb(&ktInstance->finalNode, &padding, 1) != 0)
                return 1;
            ktInstance->finalNode.byteIOIndex = (ktInstance->finalNode.byteIOIndex + 7) & ~7; /* Zero padding up to 64 bits */
        }
    }
    else if ( ktInstance->queueAbsorbedLen != 0 ) {
        /* There is data in the queue, absorb further in queue until block complete */
        unsigned int len = (inLen < (chunkSize - ktInstance->queueAbsorbedLen)) ? inLen : (chunkSize - ktInstance->queueAbsorbedLen);
        if (KeccakWidth1600_12rounds_SpongeAbsorb(&ktInstance->queueNode, input, len) != 0)
            return 1;
        input += len;
        inLen -= len;
        ktInstance->queueAbsorbedLen += len;
        if ( ktInstance->queueAbsorbedLen == chunkSize ) {
            unsigned char intermediate[capacityInBytes];
            ktInstance->queueAbsorbedLen = 0;
            ++ktInstance->blockNumber;
            if (KeccakWidth1600_12rounds_SpongeAbsorbLastFewBits(&ktInstance->queueNode, suffixLeaf) != 0)
                return 1;
            if (KeccakWidth1600_12rounds_SpongeSqueeze(&ktInstance->queueNode, intermediate, capacityInBytes) != 0)
                return 1;
            if (KeccakWidth1600_12rounds_SpongeAbsorb(&ktInstance->finalNode, intermediate, capacityInBytes) != 0)
                return 1;
        }
    }

    #if defined(KeccakP1600times8_implementation) && !defined(KeccakP1600times8_isFallback)
    #if defined(KeccakP1600times8_12rounds_FastLoop_supported)
    ParallelSpongeFastLoop( 8 )
    #else
    ParallelSpongeLoop( 8 )
    #endif
    #endif

    #if defined(KeccakP1600times4_implementation) && !defined(KeccakP1600times4_isFallback)
    #if defined(KeccakP1600times4_12rounds_FastLoop_supported)
    ParallelSpongeFastLoop( 4 )
    #else
    ParallelSpongeLoop( 4 )
    #endif
    #endif

    #if defined(KeccakP1600times2_implementation) && !defined(KeccakP1600times2_isFallback)
    #if defined(KeccakP1600times2_12rounds_FastLoop_supported)
    ParallelSpongeFastLoop( 2 )
    #else
    ParallelSpongeLoop( 2 )
    #endif
    #endif

    while ( inLen > 0 ) {
        unsigned int len = (inLen < chunkSize) ? inLen : chunkSize;
        if (KeccakWidth1600_12rounds_SpongeInitialize(&ktInstance->queueNode, rate, capacity) != 0)
            return 1;
        if (KeccakWidth1600_12rounds_SpongeAbsorb(&ktInstance->queueNode, input, len) != 0)
            return 1;
        input += len;
        inLen -= len;
        if ( len == chunkSize ) {
            unsigned char intermediate[capacityInBytes];
            ++ktInstance->blockNumber;
            if (KeccakWidth1600_12rounds_SpongeAbsorbLastFewBits(&ktInstance->queueNode, suffixLeaf) != 0)
                return 1;
            if (KeccakWidth1600_12rounds_SpongeSqueeze(&ktInstance->queueNode, intermediate, capacityInBytes) != 0)
                return 1;
            if (KeccakWidth1600_12rounds_SpongeAbsorb(&ktInstance->finalNode, intermediate, capacityInBytes) != 0)
                return 1;
        }
        else
            ktInstance->queueAbsorbedLen = len;
    }

    return 0;
}